

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<std::complex<double>_>::PrepareSystems
          (TPZDohrSubstruct<std::complex<double>_> *this)

{
  TPZFMatrix<std::complex<double>_> *this_00;
  list<long,_std::allocator<long>_> *plVar1;
  undefined8 *puVar2;
  int iVar3;
  size_t newRows;
  _List_node_base *p_Var4;
  long lVar5;
  undefined1 auVar6 [16];
  complex<double> beta;
  complex<double> *pcVar7;
  TPZFMatrix<std::complex<double>_> *z;
  long lVar8;
  int64_t iVar9;
  ulong uVar10;
  ulong in_R9;
  _List_node_base *p_Var11;
  long lVar12;
  int count;
  ulong uVar13;
  long lVar14;
  TPZFMatrix<std::complex<double>_> C_transposed;
  undefined8 in_stack_fffffffffffffd48;
  TPZFMatrix<std::complex<double>_> *pTVar15;
  undefined **ppuVar16;
  TPZAutoPointer<TPZBaseMatrix> local_288;
  TPZStepSolver<std::complex<double>_> *local_280;
  TPZFMatrix<std::complex<double>_> *local_278;
  TPZFMatrix<std::complex<double>_> local_270;
  TPZFMatrix<std::complex<double>_> local_1e0;
  TPZFMatrix<std::complex<double>_> local_150;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  iVar9 = (this->fCoarseIndex).fNElements;
  pTVar15 = &this->fC;
  lVar12 = (this->fC).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  lVar8 = (this->fC).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
  local_150.fElem = (complex<double> *)0x0;
  local_150.fGiven = (complex<double> *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar8;
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar12;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  ppuVar16 = &PTR__TPZVec_01819178;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
  local_150.fWork.fStore = (complex<double> *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  uVar13 = lVar12 * lVar8;
  if (uVar13 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (uVar13 < 0x1000000000000000) {
      uVar10 = uVar13 * 0x10;
    }
    pcVar7 = (complex<double> *)operator_new__(uVar10);
    memset(pcVar7,0,uVar13 * 0x10);
    local_150.fElem = pcVar7;
  }
  TPZFMatrix<std::complex<double>_>::Transpose
            (pTVar15,&local_150.super_TPZMatrix<std::complex<double>_>);
  iVar3 = this->fNEquations;
  lVar12 = (long)(int)iVar9;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
  local_c0.fElem = (complex<double> *)0x0;
  local_c0.fGiven = (complex<double> *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = (long)iVar3;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar12;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork.fStore = (complex<double> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar13 = iVar3 * lVar12;
  local_c0.fWork._vptr_TPZVec = (_func_int **)ppuVar16;
  if (uVar13 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (uVar13 < 0x1000000000000000) {
      uVar10 = uVar13 * 0x10;
    }
    pcVar7 = (complex<double> *)operator_new__(uVar10);
    memset(pcVar7,0,uVar13 * 0x10);
    local_c0.fElem = pcVar7;
  }
  TPZStepSolver<std::complex<double>_>::Solve
            (&this->fInvertedStiffness,&local_150,&local_c0,(TPZFMatrix<std::complex<double>_> *)0x0
            );
  newRows = (this->fInvertedStiffness).fSingular.super__List_base<long,_std::allocator<long>_>.
            _M_impl._M_node._M_size;
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable =
       (_func_int **)
       (this->fInvertedStiffness).super_TPZMatrixSolver<std::complex<double>_>.fContainer.fRef;
  LOCK();
  (((TPZReference *)
   local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
   _vptr_TPZSavable)->fCounter).super___atomic_base<int>._M_i =
       (((TPZReference *)
        local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_278 = &this->fNullPivots;
  local_280 = &this->fInvertedStiffness;
  TPZFMatrix<std::complex<double>_>::Resize
            (local_278,newRows,
             (((TPZReference *)
              local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable)->fPointer->super_TPZBaseMatrix).fCol);
  plVar1 = &(this->fInvertedStiffness).fSingular;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)&local_270);
  memset((this->fNullPivots).fElem,0,
         (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
         (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol * 0x10)
  ;
  (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  lVar8 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  p_Var11 = (this->fInvertedStiffness).fSingular.super__List_base<long,_std::allocator<long>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var11 != (_List_node_base *)plVar1 && lVar8 != 0) {
    lVar8 = 0;
    lVar14 = 0;
    do {
      p_Var4 = p_Var11[1]._M_next;
      lVar5 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
      if (((lVar5 <= lVar14) || ((long)p_Var4 < 0)) ||
         ((this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <=
          (long)p_Var4)) {
        TPZFMatrix<std::complex<double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      puVar2 = (undefined8 *)((this->fNullPivots).fElem[lVar5 * (long)p_Var4]._M_value + lVar8);
      *puVar2 = 0x3ff0000000000000;
      puVar2[1] = 0;
      lVar14 = lVar14 + 1;
      p_Var11 = p_Var11->_M_next;
      lVar8 = lVar8 + 0x10;
    } while (p_Var11 != (_List_node_base *)plVar1);
    lVar8 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  }
  lVar8 = lVar8 + lVar12;
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
  local_270.fElem = (complex<double> *)0x0;
  local_270.fGiven = (complex<double> *)0x0;
  local_270.fSize = 0;
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar8;
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar8;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork.fStore = (complex<double> *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  uVar13 = lVar8 * lVar8;
  local_270.fWork._vptr_TPZVec = (_func_int **)ppuVar16;
  if (uVar13 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (uVar13 < 0x1000000000000000) {
      uVar10 = uVar13 * 0x10;
    }
    pcVar7 = (complex<double> *)operator_new__(uVar10);
    memset(pcVar7,0,uVar13 * 0x10);
    local_270.fElem = pcVar7;
  }
  memset(local_270.fElem,0,
         local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
         local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol * 0x10);
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix._24_2_ =
       local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix._24_2_ & 0xff00;
  lVar8 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  lVar14 = lVar12;
  if (lVar8 < 1) {
    iVar9 = lVar8 + lVar12;
  }
  else {
    do {
      if (((lVar14 < 0) ||
          (local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar14)) ||
         (local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar14)) {
        TPZFMatrix<std::complex<double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *(undefined8 *)
       local_270.fElem
       [local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar14 + lVar14]
       ._M_value = 0x3ff0000000000000;
      *(undefined8 *)
       ((long)local_270.fElem
              [local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar14 +
               lVar14]._M_value + 8) = 0;
      lVar14 = lVar14 + 1;
      iVar9 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
              lVar12;
    } while (lVar14 < iVar9);
  }
  this_00 = &this->fC_star;
  TPZFMatrix<std::complex<double>_>::Resize(this_00,iVar9,(long)this->fNEquations);
  TPZMatrix<std::complex<double>_>::PutSub
            (&this_00->super_TPZMatrix<std::complex<double>_>,0,0,pTVar15);
  TPZMatrix<std::complex<double>_>::PutSub
            (&this_00->super_TPZMatrix<std::complex<double>_>,lVar12,0,local_278);
  pTVar15 = &this->fKeC_star;
  TPZFMatrix<std::complex<double>_>::Resize
            (pTVar15,(long)this->fNEquations,
             (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
             lVar12);
  iVar3 = this->fNEquations;
  lVar8 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
          lVar12;
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
  local_1e0.fElem = (complex<double> *)0x0;
  local_1e0.fGiven = (complex<double> *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = (long)iVar3;
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar8;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork.fStore = (complex<double> *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  uVar13 = lVar8 * iVar3;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)ppuVar16;
  if (uVar13 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (uVar13 < 0x1000000000000000) {
      uVar10 = uVar13 * 0x10;
    }
    pcVar7 = (complex<double> *)operator_new__(uVar10);
    memset(pcVar7,0,uVar13 * 0x10);
    local_1e0.fElem = pcVar7;
  }
  TPZFMatrix<std::complex<double>_>::Transpose
            (this_00,&local_1e0.super_TPZMatrix<std::complex<double>_>);
  TPZStepSolver<std::complex<double>_>::Solve
            (local_280,&local_1e0,pTVar15,(TPZFMatrix<std::complex<double>_> *)0x0);
  z = (TPZFMatrix<std::complex<double>_> *)operator_new(0x90);
  lVar12 = lVar12 + (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                    fRow;
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = lVar12;
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = lVar12;
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)&PTR__TPZFMatrix_01819c58;
  z->fElem = (complex<double> *)0x0;
  z->fGiven = (complex<double> *)0x0;
  z->fSize = 0;
  TPZVec<int>::TPZVec(&(z->fPivot).super_TPZVec<int>,0);
  (z->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (z->fPivot).super_TPZVec<int>.fStore = (z->fPivot).fExtAlloc;
  (z->fPivot).super_TPZVec<int>.fNElements = 0;
  (z->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (z->fWork)._vptr_TPZVec = (_func_int **)ppuVar16;
  (z->fWork).fStore = (complex<double> *)0x0;
  (z->fWork).fNElements = 0;
  (z->fWork).fNAlloc = 0;
  uVar13 = lVar12 * lVar12;
  if (uVar13 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (uVar13 < 0x1000000000000000) {
      uVar10 = uVar13 * 0x10;
    }
    pcVar7 = (complex<double> *)operator_new__(uVar10);
    memset(pcVar7,0,uVar13 * 0x10);
    z->fElem = pcVar7;
  }
  beta._M_value._8_8_ = pTVar15;
  beta._M_value._0_8_ = in_stack_fffffffffffffd48;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = in_R9;
  TPZFMatrix<std::complex<double>_>::MultAdd
            (this_00,pTVar15,&local_270,z,(complex<double>)(auVar6 << 0x40),beta,(int)ppuVar16);
  local_288.fRef = (TPZReference *)0x0;
  local_288.fRef = (TPZReference *)operator_new(0x10);
  ((local_288.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_288.fRef)->fPointer = (TPZBaseMatrix *)z;
  LOCK();
  ((local_288.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZMatrixSolver<std::complex<double>_>::SetMatrix
            (&(this->finv).super_TPZMatrixSolver<std::complex<double>_>,&local_288);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_288);
  TPZStepSolver<std::complex<double>_>::SetDirect(&this->finv,ELU);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_270);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_150);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::PrepareSystems() {
	int ncoarse = fCoarseIndex.NElements();
	//TPZFMatrix<TVar> C_transposed;
	/****************************************
	 * TEMPORARIO!!!!!!!!!!!!!!
	 */
	//  int nc = fC.Cols();
	//  fC.Redim(1,nc);
	//  fC(0,nc-1) = 1.;
	
	/*
	 *******************************************/
	/** Tou mantendo isso abaixo só pra fatoracao de K ser TVarizada e se obter os pivos nulos (caso haja) */
	
	//  ofstream out("saida.nb");
	//  this->fStiffness->Print("fK = ",out,EMathematicaInput);
	//  fC.Print("fCi = ",out,EMathematicaInput);
	TPZFMatrix<TVar> C_transposed(fC.Cols(),fC.Rows());
	fC.Transpose(&C_transposed);
	//Ke_inv*C(i)_trans
	TPZFMatrix<TVar> KeC(fNEquations,ncoarse);
	fInvertedStiffness.Solve(C_transposed,KeC);
	/** */
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Number of zero pivots of the substructure : " << fInvertedStiffness.Singular().size();
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	//  std::cout << KeC;
	//  int neq = fInvertedStiffness.Matrix()->Rows();
	//Constructing C barra = NullPivots
	fNullPivots.Resize(fInvertedStiffness.Singular().size(),fInvertedStiffness.Matrix()->Cols());
	fNullPivots.Zero();
	//  fEigenVectors.Redim(fInvertedStiffness.Matrix()->Rows(),fInvertedStiffness.Singular().size());
	if(fNullPivots.Rows())
	{
		//    out << "NullPivots = {";
		int count = 0;
		std::list<int64_t>::iterator it = fInvertedStiffness.Singular().begin();
		for(;it != fInvertedStiffness.Singular().end(); it++,count++)
		{
			//      out << *it;
			//      if(count < fInvertedStiffness.Singular().size()-1) out << ",";
			fNullPivots(count,*it) = 1.;
		}
		//    out << "};\n";
		//    fInvertedStiffness.Solve(fEigenVectors,fEigenVectors);
	}
	//  NullPivots.Print("fNullPivots = ",out,EMathematicaInput);
	
	//Constructing I star
	TPZFMatrix<TVar> I_star(ncoarse+fNullPivots.Rows(),ncoarse+fNullPivots.Rows());
	I_star.Zero();
	int i;
	for (i=ncoarse;i<ncoarse+fNullPivots.Rows();i++) {
		I_star(i,i)=1;
	}
	//Constructing C_star and storing in fC_star
	fC_star.Resize(ncoarse+fNullPivots.Rows(),fNEquations);
	fC_star.PutSub(0,0,fC);
	fC_star.PutSub(ncoarse,0,fNullPivots);
	//  C_star.Print("CStar = ",out,EMathematicaInput);
	//constructing K_star_inv*C_star_trans and storing it in fKeC_star
	fKeC_star.Resize(fNEquations,ncoarse+fNullPivots.Rows());
	TPZFMatrix<TVar> C_star_trans(fNEquations,ncoarse+fNullPivots.Rows());
	fC_star.Transpose(&C_star_trans);
	fInvertedStiffness.Solve(C_star_trans,fKeC_star);
	//Constructing StepSolver finv
	TPZFMatrix<TVar> *temp1 = new TPZFMatrix<TVar>(ncoarse+fNullPivots.Rows(),ncoarse+fNullPivots.Rows());
	fC_star.MultAdd(fKeC_star,I_star,*temp1,-1,1,0);
	finv.SetMatrix(temp1);
	finv.SetDirect(ELU);
}